

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O1

void __thiscall
ELFIO::segment_impl<ELFIO::Elf32_Phdr>::save
          (segment_impl<ELFIO::Elf32_Phdr> *this,ostream *stream,streampos header_offset,
          streampos data_offset)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = (uint)data_offset._M_off;
  (this->ph).p_offset = uVar2;
  uVar1 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  if (this->convertor->need_conversion == false) {
    uVar1 = uVar2;
  }
  (this->ph).p_offset = uVar1;
  adjust_stream_size(stream,header_offset._M_off);
  std::ostream::write((char *)stream,(long)&this->ph);
  return;
}

Assistant:

void save( std::ostream&  stream,
               std::streampos header_offset,
               std::streampos data_offset ) override
    {
        ph.p_offset = decltype( ph.p_offset )( data_offset );
        ph.p_offset = ( *convertor )( ph.p_offset );
        adjust_stream_size( stream, header_offset );
        stream.write( reinterpret_cast<const char*>( &ph ), sizeof( ph ) );
    }